

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YolactDetector.cpp
# Opt level: O3

int __thiscall
Yolact::detect(Yolact *this,Mat *image,vector<Object,_std::allocator<Object>_> *objects,
              string *targetName)

{
  vector<Object,_std::allocator<Object>_> *objects_00;
  undefined8 uVar1;
  undefined8 uVar2;
  uint h;
  uint w;
  pointer pOVar3;
  pointer pfVar4;
  int *piVar5;
  int iVar6;
  int iVar7;
  pointer pfVar8;
  int iVar9;
  size_type __new_size;
  void *pvVar10;
  void *pvVar11;
  pointer pOVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  void *pvVar16;
  int j;
  int iVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  vector<Object,_std::allocator<Object>_> *this_00;
  float *mp;
  long lVar21;
  float *__first;
  pointer pOVar22;
  long lVar23;
  float fVar24;
  float fVar25;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined1 auVar26 [16];
  float fVar27;
  float fVar29;
  float fVar30;
  undefined1 auVar28 [16];
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar36;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float local_4c8;
  float fStack_4c4;
  int *local_498;
  float local_488;
  float fStack_484;
  uint local_460;
  uint local_45c;
  vector<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
  class_candidates;
  void *local_408;
  int *piStack_400;
  Mat local_3c8;
  Mat local_388;
  Mat local_348;
  void *ptr;
  undefined8 uStack_300;
  undefined8 local_2f8;
  pointer local_2f0;
  pointer pfStack_2e8;
  pointer local_2e0;
  Mat local_2d8 [96];
  Mat local_278;
  undefined4 local_230 [2];
  Mat *local_228;
  undefined8 local_220;
  Mat mask2;
  pointer pfStack_210;
  pointer local_208;
  long *local_1d0;
  Extractor ex;
  Mat local_168;
  undefined8 local_128;
  Mat *pMStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  float norm_vals [3];
  float mean_vals [3];
  Net yolact;
  
  ncnn::Net::Net(&yolact);
  yolact.opt.use_vulkan_compute = false;
  ncnn::Net::load_param(&yolact,"yolact.param");
  ncnn::Net::load_model(&yolact,"yolact.bin");
  h = *(uint *)(image + 8);
  w = *(uint *)(image + 0xc);
  ncnn::Mat::from_pixels_resize
            (&local_168,*(uchar **)(image + 0x10),0x10002,w,h,0x226,0x226,(Allocator *)0x0);
  mean_vals[0] = 123.68;
  mean_vals[1] = 116.78;
  mean_vals[2] = 103.94;
  norm_vals[0] = 0.017123288;
  norm_vals[1] = 0.017507004;
  norm_vals[2] = 0.017427675;
  ncnn::Mat::substract_mean_normalize(&local_168,mean_vals,norm_vals);
  ncnn::Net::create_extractor(&ex,&yolact);
  ncnn::Extractor::input(&ex,"input.1",&local_168);
  local_348.elemsize._0_4_ = 0;
  local_348.elemsize._4_4_ = 0;
  local_348.elempack = 0;
  local_348.data = (void *)0x0;
  local_348.refcount._0_4_ = 0;
  local_348.refcount._4_4_ = 0;
  local_348.allocator = (Allocator *)0x0;
  local_348.dims = 0;
  local_348.w = 0;
  local_348.h = 0;
  local_348.c = 0;
  local_348.cstep = 0;
  local_278.elemsize._0_4_ = 0;
  local_278.elemsize._4_4_ = 0;
  local_278.elempack = 0;
  local_278.data = (void *)0x0;
  local_278.refcount._0_4_ = 0;
  local_278.refcount._4_4_ = 0;
  local_278.allocator = (Allocator *)0x0;
  local_278.dims = 0;
  local_278.w = 0;
  local_278.h = 0;
  local_278.c = 0;
  local_278.cstep = 0;
  local_388.elemsize._0_4_ = 0;
  local_388.elemsize._4_4_ = 0;
  local_388.elempack = 0;
  local_388.data = (void *)0x0;
  local_388.refcount._0_4_ = 0;
  local_388.refcount._4_4_ = 0;
  local_388.allocator = (Allocator *)0x0;
  local_388.dims = 0;
  local_388.w = 0;
  local_388.h = 0;
  local_388.c = 0;
  local_388.cstep = 0;
  local_3c8.elemsize._0_4_ = 0;
  local_3c8.elemsize._4_4_ = 0;
  local_3c8.elempack = 0;
  local_3c8.data = (void *)0x0;
  local_3c8.refcount._0_4_ = 0;
  local_3c8.refcount._4_4_ = 0;
  local_3c8.allocator = (Allocator *)0x0;
  local_3c8.dims = 0;
  local_3c8.w = 0;
  local_3c8.h = 0;
  local_3c8.c = 0;
  local_3c8.cstep = 0;
  ncnn::Extractor::extract(&ex,"619",&local_348);
  ncnn::Extractor::extract(&ex,"816",&local_278);
  ncnn::Extractor::extract(&ex,"818",&local_388);
  ncnn::Extractor::extract(&ex,"820",&local_3c8);
  iVar6 = local_3c8.w;
  __new_size = (size_type)local_3c8.w;
  iVar7 = local_3c8.h;
  lVar14 = (long)local_3c8.h;
  local_408 = (void *)0x0;
  piStack_400 = (int *)0x0;
  if (lVar14 == 0) {
    pvVar16 = (void *)0x0;
  }
  else {
    ptr = (void *)0x0;
    iVar9 = posix_memalign(&ptr,0x10,lVar14 * 0x10 + 4);
    local_408 = (void *)0x0;
    if (iVar9 == 0) {
      local_408 = ptr;
    }
    piStack_400 = (int *)((long)local_408 + lVar14 * 0x10);
    *piStack_400 = 1;
    pvVar16 = ptr;
  }
  lVar14 = 0;
  pvVar11 = pvVar16;
  do {
    fVar27 = (float)(&DAT_00183ab0)[lVar14];
    iVar9 = (&DAT_00183a90)[lVar14];
    iVar18 = iVar9;
    if (iVar9 < 2) {
      iVar18 = 1;
    }
    iVar13 = 0;
    do {
      iVar17 = 0;
      do {
        pvVar10 = pvVar11;
        lVar23 = 0;
        lVar21 = 0;
        do {
          fVar24 = *(float *)((long)&DAT_00183aa4 + lVar21);
          if (fVar24 < 0.0) {
            fVar24 = sqrtf(fVar24);
          }
          else {
            fVar24 = SQRT(fVar24);
          }
          fVar24 = (fVar24 * fVar27) / 550.0;
          *(float *)((long)pvVar10 + lVar21 * 4) = ((float)iVar17 + 0.5) / (float)iVar9;
          *(float *)((long)pvVar10 + lVar21 * 4 + 4) = ((float)iVar13 + 0.5) / (float)iVar9;
          *(float *)((long)pvVar10 + lVar21 * 4 + 8) = fVar24;
          *(float *)((long)pvVar10 + lVar21 * 4 + 0xc) = fVar24;
          lVar21 = lVar21 + 4;
          lVar23 = lVar23 + -0x10;
        } while (lVar21 != 0xc);
        iVar17 = iVar17 + 1;
        pvVar11 = (void *)((long)pvVar10 - lVar23);
      } while (iVar17 != iVar18);
      iVar13 = iVar13 + 1;
      pvVar11 = (void *)((long)pvVar10 - lVar23);
    } while (iVar13 != iVar18);
    lVar14 = lVar14 + 1;
    pvVar11 = (void *)((long)pvVar10 - lVar23);
  } while (lVar14 != 5);
  class_candidates.
  super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
  ._M_impl.super__Vector_impl_data._0_12_ = ZEXT812(0);
  class_candidates.
  super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  class_candidates.
  super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
  ::resize(&class_candidates,__new_size);
  if (0 < iVar7) {
    iVar9 = 0;
    do {
      pvVar11 = local_278.data;
      if (1 < iVar6) {
        lVar14 = (long)local_278.w * (long)iVar9 *
                 CONCAT44(local_278.elemsize._4_4_,(undefined4)local_278.elemsize);
        __first = (float *)((long)local_388.w * (long)iVar9 *
                            CONCAT44(local_388.elemsize._4_4_,(undefined4)local_388.elemsize) +
                           (long)local_388.data);
        fVar27 = 0.0;
        uVar19 = 0;
        uVar15 = 1;
        do {
          fVar24 = *(float *)((long)local_3c8.data +
                             uVar15 * 4 +
                             (long)(local_3c8.w * iVar9) *
                             CONCAT44(local_3c8.elemsize._4_4_,(undefined4)local_3c8.elemsize));
          if (fVar27 < fVar24) {
            uVar19 = uVar15 & 0xffffffff;
            fVar27 = fVar24;
          }
          uVar15 = uVar15 + 1;
        } while ((uint)iVar6 != uVar15);
        iVar18 = (int)uVar19;
        if ((iVar18 != 0) && (0.2 < fVar27)) {
          iVar13 = std::__cxx11::string::compare((char *)targetName);
          if (iVar13 == 0) {
            fVar24 = expf(*(float *)((long)pvVar11 + lVar14 + 8) * 0.2);
            fVar25 = expf(*(float *)((long)pvVar11 + lVar14 + 0xc) * 0.2);
            uVar1 = *(undefined8 *)((long)pvVar16 + (ulong)(uint)(iVar9 * 4) * 4);
            uVar2 = *(undefined8 *)((long)pvVar16 + (ulong)(uint)(iVar9 * 4) * 4 + 8);
            fVar29 = (float)uVar2;
            fVar30 = (float)((ulong)uVar2 >> 0x20);
            fVar33 = (float)*(undefined8 *)((long)pvVar11 + lVar14) * 0.1 * fVar29 + (float)uVar1;
            fVar36 = (float)((ulong)*(undefined8 *)((long)pvVar11 + lVar14) >> 0x20) * 0.1 * fVar30
                     + (float)((ulong)uVar1 >> 0x20);
            fVar24 = fVar24 * fVar29 * 0.5;
            fVar25 = fVar25 * fVar30 * 0.5;
            fVar29 = extraout_XMM0_Db * 0.0 * 0.0;
            fVar30 = extraout_XMM0_Db_00 * 0.0 * 0.0;
            iVar13 = (int)*(undefined8 *)(image + 8);
            iVar17 = (int)((ulong)*(undefined8 *)(image + 8) >> 0x20);
            fVar31 = (float)iVar17;
            fVar32 = (float)iVar13;
            auVar26._0_4_ = (fVar33 - fVar24) * fVar31;
            auVar26._4_4_ = (fVar36 - fVar25) * fVar32;
            auVar26._8_4_ = (0.0 - fVar29) * 0.0;
            auVar26._12_4_ = (0.0 - fVar30) * 0.0;
            auVar28._0_8_ = CONCAT44((float)(iVar13 + -1),(float)(iVar17 + -1));
            auVar28._8_4_ = 0xbf800000;
            auVar28._12_4_ = 0xbf800000;
            auVar34._8_4_ = 0xbf800000;
            auVar34._0_8_ = auVar28._0_8_;
            auVar34._12_4_ = 0xbf800000;
            auVar35 = minps(auVar34,auVar26);
            auVar26 = maxps(ZEXT816(0),auVar35);
            auVar35._4_4_ = (fVar25 + fVar36) * fVar32;
            auVar35._0_4_ = (fVar24 + fVar33) * fVar31;
            auVar35._8_4_ = (fVar29 + 0.0) * 0.0;
            auVar35._12_4_ = (fVar30 + 0.0) * 0.0;
            auVar35 = minps(auVar28,auVar35);
            auVar35 = maxps(ZEXT816(0),auVar35);
            ptr = (void *)0x0;
            uStack_300 = (pointer)0x0;
            local_2f0 = (pointer)0x0;
            pfStack_2e8 = (pointer)0x0;
            local_2e0 = (pointer)0x0;
            cv::Mat::Mat(local_2d8);
            local_4c8 = auVar26._0_4_;
            fStack_4c4 = auVar26._4_4_;
            local_488 = auVar35._0_4_;
            fStack_484 = auVar35._4_4_;
            ptr = auVar26._0_8_;
            uStack_300 = (pointer)CONCAT44((fStack_484 - fStack_4c4) + 1.0,
                                           (local_488 - local_4c8) + 1.0);
            local_2f8 = (pointer)CONCAT44(fVar27,iVar18);
            std::vector<float,std::allocator<float>>::vector<float_const*,void>
                      ((vector<float,std::allocator<float>> *)&mask2,__first,__first + local_388.w,
                       (allocator_type *)&local_128);
            pfVar8 = local_2e0;
            pfVar4 = local_2f0;
            local_2f0 = _mask2;
            pfStack_2e8 = pfStack_210;
            local_2e0 = local_208;
            _mask2 = (pointer)0x0;
            pfStack_210 = (pointer)0x0;
            local_208 = (pointer)0x0;
            if ((pfVar4 != (pointer)0x0) &&
               (operator_delete(pfVar4,(long)pfVar8 - (long)pfVar4), _mask2 != (pointer)0x0)) {
              operator_delete(_mask2,-(long)_mask2);
            }
            std::vector<Object,_std::allocator<Object>_>::push_back
                      (class_candidates.
                       super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + iVar18,(value_type *)&ptr);
            cv::Mat::~Mat(local_2d8);
            if (local_2f0 != (pointer)0x0) {
              operator_delete(local_2f0,(long)local_2e0 - (long)local_2f0);
            }
          }
        }
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 != iVar7);
  }
  this_00 = objects;
  std::vector<Object,_std::allocator<Object>_>::_M_erase_at_end
            (objects,(objects->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
                     super__Vector_impl_data._M_start);
  if (0 < (int)((ulong)((long)class_candidates.
                              super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)class_candidates.
                             super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
    lVar14 = 0;
    do {
      objects_00 = class_candidates.
                   super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar14;
      pOVar3 = (objects_00->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pOVar12 = (objects_00->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      if (pOVar3 != pOVar12) {
        this_00 = (vector<Object,_std::allocator<Object>_> *)this;
        qsort_descent_inplace
                  (this,objects_00,0,
                   (int)((ulong)((long)pOVar12 - (long)pOVar3) >> 4) * 0x38e38e39 + -1);
      }
      ptr = (void *)0x0;
      uStack_300 = (pointer)0x0;
      local_2f8 = (pointer)0x0;
      nms_sorted_bboxes((Yolact *)this_00,objects_00,(vector<int,_std::allocator<int>_> *)&ptr,0.5);
      if (0 < (int)((ulong)((long)uStack_300 - (long)ptr) >> 2)) {
        lVar21 = 0;
        do {
          std::vector<Object,_std::allocator<Object>_>::push_back
                    (objects,(objects_00->super__Vector_base<Object,_std::allocator<Object>_>).
                             _M_impl.super__Vector_impl_data._M_start +
                             *(int *)((long)ptr + lVar21 * 4));
          lVar21 = lVar21 + 1;
        } while (lVar21 < (int)((ulong)((long)uStack_300 - (long)ptr) >> 2));
      }
      this_00 = (vector<Object,_std::allocator<Object>_> *)ptr;
      if (ptr != (void *)0x0) {
        operator_delete(ptr,(long)local_2f8 - (long)ptr);
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < (int)((ulong)((long)class_candidates.
                                          super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)class_candidates.
                                         super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                      -0x55555555);
  }
  pOVar12 = (objects->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pOVar3 = (objects->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pOVar22 = pOVar12;
  if (pOVar12 != pOVar3) {
    qsort_descent_inplace
              (this,objects,0,(int)((ulong)((long)pOVar3 - (long)pOVar12) >> 4) * 0x38e38e39 + -1);
    pOVar12 = (objects->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    pOVar22 = (objects->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
              super__Vector_impl_data._M_start;
  }
  if (200 < (int)((ulong)((long)pOVar12 - (long)pOVar22) >> 4) * 0x38e38e39) {
    std::vector<Object,_std::allocator<Object>_>::resize(objects,200);
    pOVar22 = (objects->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pOVar12 = (objects->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  }
  local_498 = piStack_400;
  if (pOVar12 != pOVar22) {
    uVar19 = 0;
    do {
      cv::Mat::Mat((Mat *)&ptr,local_348.h,local_348.w,5);
      _mask2 = (pointer)0x0;
      cv::Mat::operator=((Mat *)&ptr,(Scalar_ *)&mask2);
      pOVar22 = pOVar22 + uVar19;
      if (0 < (long)local_348.c) {
        pfVar4 = (pOVar22->maskdata).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar14 = 0;
        pvVar16 = local_348.data;
        do {
          if (0 < local_348.h * local_348.w) {
            fVar27 = pfVar4[lVar14];
            uVar15 = 0;
            do {
              local_2f8[uVar15] =
                   (int)(*(float *)((long)pvVar16 + uVar15 * 4) * fVar27 + (float)local_2f8[uVar15])
              ;
              uVar15 = uVar15 + 1;
            } while ((uint)(local_348.h * local_348.w) != uVar15);
          }
          lVar14 = lVar14 + 1;
          pvVar16 = (void *)((long)pvVar16 +
                            local_348.cstep *
                            CONCAT44(local_348.elemsize._4_4_,(undefined4)local_348.elemsize));
        } while (lVar14 != local_348.c);
      }
      cv::Mat::Mat(&mask2);
      local_118 = 0;
      local_128 = CONCAT44(local_128._4_4_,0x1010000);
      local_220 = 0;
      local_230[0] = 0x2010000;
      local_460 = w;
      local_45c = h;
      local_228 = &mask2;
      pMStack_120 = (Mat *)&ptr;
      cv::resize((Mat *)&local_128,local_230,&local_460);
      cv::Mat::Mat((Mat *)&local_128,h,w,0);
      cv::Mat::operator=(&pOVar22->mask,(Mat *)&local_128);
      cv::Mat::~Mat((Mat *)&local_128);
      local_118 = 0;
      uStack_110 = 0;
      local_128 = 0;
      pMStack_120 = (Mat *)0x0;
      cv::Mat::operator=(&pOVar22->mask,(Scalar_ *)&local_128);
      if (0 < (int)h) {
        uVar15 = 0;
        do {
          fVar27 = (pOVar22->rect).y;
          if (((fVar27 <= (float)(int)uVar15) &&
              ((float)(int)uVar15 <= fVar27 + (pOVar22->rect).height)) && (0 < (int)w)) {
            lVar14 = **(long **)&pOVar22->field_0x78;
            lVar21 = *(long *)&pOVar22->field_0x40;
            lVar23 = *local_1d0;
            uVar20 = 0;
            do {
              fVar27 = (pOVar22->rect).x;
              if ((fVar27 <= (float)(int)uVar20) &&
                 ((float)(int)uVar20 <= fVar27 + (pOVar22->rect).width)) {
                *(char *)(lVar14 * uVar15 + lVar21 + uVar20) =
                     -(0.5 < *(float *)(lVar23 * uVar15 + uVar20 * 4));
              }
              uVar20 = uVar20 + 1;
            } while (w != uVar20);
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 != h);
      }
      cv::Mat::~Mat(&mask2);
      cv::Mat::~Mat((Mat *)&ptr);
      uVar19 = uVar19 + 1;
      pOVar22 = (objects->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar15 = ((long)(objects->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)pOVar22 >> 4) * -0x71c71c71c71c71c7;
    } while (uVar19 <= uVar15 && uVar15 - uVar19 != 0);
  }
  std::
  vector<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
  ::~vector(&class_candidates);
  if (local_498 != (int *)0x0) {
    LOCK();
    *local_498 = *local_498 + -1;
    UNLOCK();
    if ((*local_498 == 0) && (local_408 != (void *)0x0)) {
      free(local_408);
    }
  }
  piVar5 = (int *)CONCAT44(local_3c8.refcount._4_4_,local_3c8.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_3c8.allocator == (Allocator *)0x0) {
        if (local_3c8.data != (void *)0x0) {
          free(local_3c8.data);
        }
      }
      else {
        (**(code **)(*(long *)local_3c8.allocator + 0x18))();
      }
    }
  }
  piVar5 = (int *)CONCAT44(local_388.refcount._4_4_,local_388.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_388.allocator == (Allocator *)0x0) {
        if (local_388.data != (void *)0x0) {
          free(local_388.data);
        }
      }
      else {
        (**(code **)(*(long *)local_388.allocator + 0x18))();
      }
    }
  }
  piVar5 = (int *)CONCAT44(local_278.refcount._4_4_,local_278.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_278.allocator == (Allocator *)0x0) {
        if (local_278.data != (void *)0x0) {
          free(local_278.data);
        }
      }
      else {
        (**(code **)(*(long *)local_278.allocator + 0x18))();
      }
    }
  }
  piVar5 = (int *)CONCAT44(local_348.refcount._4_4_,local_348.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_348.allocator == (Allocator *)0x0) {
        if (local_348.data != (void *)0x0) {
          free(local_348.data);
        }
      }
      else {
        (**(code **)(*(long *)local_348.allocator + 0x18))();
      }
    }
  }
  ncnn::Extractor::~Extractor(&ex);
  if (local_168.refcount != (int *)0x0) {
    LOCK();
    *local_168.refcount = *local_168.refcount + -1;
    UNLOCK();
    if (*local_168.refcount == 0) {
      if (local_168.allocator == (Allocator *)0x0) {
        if (local_168.data != (void *)0x0) {
          free(local_168.data);
        }
      }
      else {
        (**(code **)(*(long *)local_168.allocator + 0x18))();
      }
    }
  }
  ncnn::Net::~Net(&yolact);
  return 0;
}

Assistant:

int Yolact::detect(cv::Mat& image, std::vector<Object>& objects, const std::string &targetName) 
{
    ncnn::Net yolact;

    yolact.opt.use_vulkan_compute = false;

    // original model converted from https://github.com/dbolya/yolact
    // yolact_resnet50_54_800000.pth
    // the ncnn model https://github.com/nihui/ncnn-assets/tree/master/models
    yolact.load_param("yolact.param");
    yolact.load_model("yolact.bin");

    const int target_size = 550;

    int img_w = image.cols;
    int img_h = image.rows;

    ncnn::Mat in = ncnn::Mat::from_pixels_resize(image.data, ncnn::Mat::PIXEL_BGR2RGB, img_w, img_h, target_size, target_size);

    const float mean_vals[3] = {123.68f, 116.78f, 103.94f};
    const float norm_vals[3] = {1.0 / 58.40f, 1.0 / 57.12f, 1.0 / 57.38f};
    in.substract_mean_normalize(mean_vals, norm_vals);

    ncnn::Extractor ex = yolact.create_extractor();
    //     ex.set_num_threads(4);

    ex.input("input.1", in);

    ncnn::Mat maskmaps;
    ncnn::Mat location;
    ncnn::Mat mask;
    ncnn::Mat confidence;

    ex.extract("619", maskmaps); // 138x138 x 32

    ex.extract("816", location);   // 4 x 19248
    ex.extract("818", mask);       // maskdim 32 x 19248
    ex.extract("820", confidence); // 81 x 19248

    int num_class = confidence.w;
    int num_priors = confidence.h;

    // make priorbox
    ncnn::Mat priorbox(4, num_priors);
    {
        const int conv_ws[5] = {69, 35, 18, 9, 5};
        const int conv_hs[5] = {69, 35, 18, 9, 5};

        const float aspect_ratios[3] = {1.f, 0.5f, 2.f};
        const float scales[5] = {24.f, 48.f, 96.f, 192.f, 384.f};

        float* pb = priorbox;

        for (int p = 0; p < 5; p++)
        {
            int conv_w = conv_ws[p];
            int conv_h = conv_hs[p];

            float scale = scales[p];

            for (int i = 0; i < conv_h; i++)
            {
                for (int j = 0; j < conv_w; j++)
                {
                    // +0.5 because priors are in center-size notation
                    float cx = (j + 0.5f) / conv_w;
                    float cy = (i + 0.5f) / conv_h;

                    for (int k = 0; k < 3; k++)
                    {
                        float ar = aspect_ratios[k];

                        ar = sqrt(ar);

                        float w = scale * ar / 550;
                        float h = scale / ar / 550;

                        // This is for backward compatability with a bug where I made everything square by accident
                        // cfg.backbone.use_square_anchors:
                        h = w;

                        pb[0] = cx;
                        pb[1] = cy;
                        pb[2] = w;
                        pb[3] = h;

                        pb += 4;
                    }
                }
            }
        }
    }

    const float confidence_thresh = 0.2f;
    const float nms_threshold = 0.5f;
    const int keep_top_k = 200;

    std::vector<std::vector<Object> > class_candidates;
    class_candidates.resize(num_class);

    for (int i = 0; i < num_priors; i++)
    {
        const float* conf = confidence.row(i);
        const float* loc = location.row(i);
        const float* pb = priorbox.row(i);
        const float* maskdata = mask.row(i);

        // find class id with highest score
        // start from 1 to skip background
        int label = 0;
        float score = 0.f;
        for (int j = 1; j < num_class; j++)
        {
            float class_score = conf[j];
            if (class_score > score)
            {
                label = j;
                score = class_score;
            }
        }

        // ignore background or low score
        if (label == 0 || score <= confidence_thresh || !isTargetObj(label, targetName))
            continue;

        // CENTER_SIZE
        float var[4] = {0.1f, 0.1f, 0.2f, 0.2f};

        float pb_cx = pb[0];
        float pb_cy = pb[1];
        float pb_w = pb[2];
        float pb_h = pb[3];

        float bbox_cx = var[0] * loc[0] * pb_w + pb_cx;
        float bbox_cy = var[1] * loc[1] * pb_h + pb_cy;
        float bbox_w = (float)(exp(var[2] * loc[2]) * pb_w);
        float bbox_h = (float)(exp(var[3] * loc[3]) * pb_h);

        float obj_x1 = bbox_cx - bbox_w * 0.5f;
        float obj_y1 = bbox_cy - bbox_h * 0.5f;
        float obj_x2 = bbox_cx + bbox_w * 0.5f;
        float obj_y2 = bbox_cy + bbox_h * 0.5f;

        // clip
        obj_x1 = std::max(std::min(obj_x1 * image.cols, (float)(image.cols - 1)), 0.f);
        obj_y1 = std::max(std::min(obj_y1 * image.rows, (float)(image.rows - 1)), 0.f);
        obj_x2 = std::max(std::min(obj_x2 * image.cols, (float)(image.cols - 1)), 0.f);
        obj_y2 = std::max(std::min(obj_y2 * image.rows, (float)(image.rows - 1)), 0.f);

        // append object
        Object obj;
        obj.rect = cv::Rect_<float>(obj_x1, obj_y1, obj_x2 - obj_x1 + 1, obj_y2 - obj_y1 + 1);
        obj.label = label;
        obj.prob = score;
        obj.maskdata = std::vector<float>(maskdata, maskdata + mask.w);

        class_candidates[label].push_back(obj);
    }

    objects.clear();
    for (int i = 0; i < (int)class_candidates.size(); i++)
    {
        std::vector<Object>& candidates = class_candidates[i];

        qsort_descent_inplace(candidates);

        std::vector<int> picked;
        nms_sorted_bboxes(candidates, picked, nms_threshold);

        for (int j = 0; j < (int)picked.size(); j++)
        {
            int z = picked[j];
            objects.push_back(candidates[z]);
        }
    }

    qsort_descent_inplace(objects);

    // keep_top_k
    if (keep_top_k < (int)objects.size())
    {
        objects.resize(keep_top_k);
    }

    // generate mask
    for (int i = 0; i < objects.size(); i++)
    {
        Object& obj = objects[i];

        cv::Mat mask(maskmaps.h, maskmaps.w, CV_32FC1);
        {
            mask = cv::Scalar(0.f);

            for (int p = 0; p < maskmaps.c; p++)
            {
                const float* maskmap = maskmaps.channel(p);
                float coeff = obj.maskdata[p];
                float* mp = (float*)mask.data;

                // mask += m * coeff
                for (int j = 0; j < maskmaps.w * maskmaps.h; j++)
                {
                    mp[j] += maskmap[j] * coeff;
                }
            }
        }

        cv::Mat mask2;
        cv::resize(mask, mask2, cv::Size(img_w, img_h));

        // crop obj box and binarize
        obj.mask = cv::Mat(img_h, img_w, CV_8UC1);
        {
            obj.mask = cv::Scalar(0);

            for (int y = 0; y < img_h; y++)
            {
                if (y < obj.rect.y || y > obj.rect.y + obj.rect.height)
                    continue;

                const float* mp2 = mask2.ptr<const float>(y);
                uchar* bmp = obj.mask.ptr<uchar>(y);

                for (int x = 0; x < img_w; x++)
                {
                    if (x < obj.rect.x || x > obj.rect.x + obj.rect.width)
                        continue;

                    bmp[x] = mp2[x] > 0.5f ? 255 : 0;
                }
            }
        }
    }

    return 0;    
}